

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall deci::ast_postfix_t::~ast_postfix_t(ast_postfix_t *this)

{
  ast_arg_list_t *this_00;
  
  this_00 = this->arglist;
  if (this_00 != (ast_arg_list_t *)0x0) {
    ast_arg_list_t::~ast_arg_list_t(this_00);
  }
  operator_delete(this_00);
  std::__cxx11::string::~string((string *)&this->identifier);
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d3d8;
  return;
}

Assistant:

ast_postfix_t::~ast_postfix_t() {
    delete this->arglist;
  }